

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O1

int t_getc(void *data)

{
  char cVar1;
  
  cVar1 = *(char *)(*(long *)((long)data + 8) + *data);
  if (cVar1 != '\0') {
    *(long *)data = *data + 1;
    return (int)cVar1;
  }
  return -1;
}

Assistant:

static int t_getc(void *data) {
  struct ReadBuffer *buffer = data;
  int c = buffer->Source_code[buffer->Current_char];

  if (c == 0)
    c = EOF;
  else
    buffer->Current_char++;
  return c;
}